

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void printState(microseconds time,Timeline *timeline,size_t numPeers,double quantum)

{
  UdpSender *this;
  _Head_base<0UL,_long,_false> _Var1;
  long lVar2;
  ostream *poVar3;
  OutboundPacketStream *pOVar4;
  char *packet;
  size_t sVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  OutboundPacketStream p;
  Beats beat;
  BeginMessage local_488;
  OutboundPacketStream local_480;
  long local_448;
  _Tuple_impl<0UL,_long> local_440;
  Timeline local_438 [43];
  
  _Var1._M_head_impl = llround(quantum * 1000000.0);
  ableton::link::Timeline::toBeats(local_438,(microseconds)&timeline->mTimeline);
  local_488.addressPattern =
       (char *)(CONCAT71(local_438[0].tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
                         super__Head_base<0UL,_double,_false>._M_head_impl._1_7_,
                         local_438[0].tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
                         super__Head_base<0UL,_double,_false>._M_head_impl._0_1_) -
               (timeline->mTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
               super__Head_base<0UL,_long,_false>._M_head_impl);
  local_440.super__Head_base<0UL,_long,_false>._M_head_impl =
       (_Head_base<0UL,_long,_false>)(_Head_base<0UL,_long,_false>)_Var1._M_head_impl;
  ableton::link::closestPhaseMatch
            ((link *)&local_448,(Beats *)&local_480,(Beats *)&local_488,(Beats *)&local_440);
  dVar7 = ableton::Link::Timeline::phaseAtTime(timeline,time,quantum);
  dVar8 = ((timeline->mTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
           super__Head_base<0UL,_double,_false>._M_head_impl / quantum) / 60.0;
  if (printState::diff == 0) {
    lVar2 = std::chrono::_V2::system_clock::now();
    printState::diff = ((lVar2 / 1000000) * 1000 - time.__r) + 500;
  }
  dVar10 = (double)(time.__r + printState::diff) / 1000000.0 + -0.2;
  dVar9 = floor(dVar10);
  dVar10 = floor((dVar10 - (double)(int)dVar9) * 1000000.0);
  *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xfffffefb;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"peers: ",7);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," | ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"quantum: ",9);
  poVar3 = std::ostream::_M_insert<double>(quantum);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," | ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"tempo: ",7);
  poVar3 = std::ostream::_M_insert<double>
                     ((timeline->mTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>
                      .super__Head_base<0UL,_double,_false>._M_head_impl);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," | ",3);
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"beats: ",7);
  poVar3 = std::ostream::_M_insert<double>((double)local_448 / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," | sec: ",8);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(int)dVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," | usec: ",9);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(int)dVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," | ",3);
  if ((dVar8 != printState::last_cps) || (NAN(dVar8) || NAN(printState::last_cps))) {
    osc::OutboundPacketStream::OutboundPacketStream(&local_480,(char *)local_438,0x400);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nnew cps: ",10);
    poVar3 = std::ostream::_M_insert<double>(dVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," | last cps: ",0xd);
    poVar3 = std::ostream::_M_insert<double>(printState::last_cps);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    local_488.addressPattern = "/tempo";
    printState::last_cps = dVar8;
    pOVar4 = osc::OutboundPacketStream::operator<<(&local_480,&local_488);
    pOVar4 = osc::OutboundPacketStream::operator<<(pOVar4,(int)dVar9);
    pOVar4 = osc::OutboundPacketStream::operator<<(pOVar4,(int)dVar10);
    pOVar4 = osc::OutboundPacketStream::operator<<
                       (pOVar4,(float)(((double)local_448 / 1000000.0) / quantum));
    pOVar4 = osc::OutboundPacketStream::operator<<(pOVar4,(float)dVar8);
    pOVar4 = osc::OutboundPacketStream::operator<<(pOVar4,"True");
    osc::OutboundPacketStream::operator<<(pOVar4,(MessageTerminator *)&osc::EndMessage);
    this = sender;
    packet = osc::OutboundPacketStream::Data(&local_480);
    sVar5 = osc::OutboundPacketStream::Size(&local_480);
    UdpSender::Send(this,packet,(int)sVar5);
    osc::OutboundPacketStream::~OutboundPacketStream(&local_480);
  }
  dVar8 = ceil(quantum);
  dVar9 = 0.0;
  if (0.0 < dVar8) {
    iVar6 = 1;
    do {
      if (dVar7 <= dVar9) {
        local_438[0].tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
        super__Head_base<0UL,_double,_false>._M_head_impl._0_1_ = 0x4f;
      }
      else {
        local_438[0].tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
        super__Head_base<0UL,_double,_false>._M_head_impl._0_1_ = 0x58;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_438,1);
      dVar9 = (double)iVar6;
      iVar6 = iVar6 + 1;
    } while (dVar9 < dVar8);
  }
  clearLine();
  return;
}

Assistant:

void printState(const std::chrono::microseconds time,
    const ableton::Link::Timeline timeline,
    const std::size_t numPeers,
    const double quantum)
{
  const auto beats = timeline.beatAtTime(time, quantum);
  const auto phase = timeline.phaseAtTime(time, quantum);
  const auto cycle = beats / quantum;
  const double cps = (timeline.tempo() / quantum) / 60;
  const auto t     = std::chrono::microseconds(time).count();
  static long diff = 0;
  static double last_cps = -1;
  //const auto time = state.link.clock().micros();
  
  if (diff == 0) {
    unsigned long milliseconds_since_epoch = 
      std::chrono::duration_cast<std::chrono::milliseconds>
      (std::chrono::system_clock::now().time_since_epoch()).count();
    // POSIX is millis and Link is micros.. Not sure if that `+500` helps
    diff = ((milliseconds_since_epoch*1000 + 500) - t);
  }
  double timetag_ut = ((double) (t + diff)) / ((double) 1000000);
  // latency hack
  timetag_ut -= 0.2;
  int sec = floor(timetag_ut);
  int usec = floor(1000000 * (timetag_ut - sec));

  std::cout << std::defaultfloat << "peers: " << numPeers << " | "
            << "quantum: " << quantum << " | "
            << "tempo: " << timeline.tempo() << " | " << std::fixed << "beats: " << beats
            << " | sec: " << sec
            << " | usec: " << usec
            << " | ";
  if (cps != last_cps) {
    //UdpBroadcastSocket s(IpEndpointName( "127.255.255.255", 6040));
    char buffer[OUTPUT_BUFFER_SIZE];
    osc::OutboundPacketStream p( buffer, OUTPUT_BUFFER_SIZE );
    std::cout << "\nnew cps: " << cps << " | last cps: " << last_cps << "\n";
    last_cps = cps;

    p << osc::BeginMessage( "/tempo" )
      << sec << usec
      << (float) cycle << (float) cps << "True" << osc::EndMessage;
    //s.Send( p.Data(), p.Size() );
    sender->Send((char *)p.Data(), p.Size());
  }
  for (int i = 0; i < ceil(quantum); ++i)
  {
    if (i < phase)
    {
      std::cout << 'X';
    }
    else
    {
      std::cout << 'O';
    }
  }
  clearLine();
}